

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O3

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitHeaderGenerator
          (InstructionDisassembler *this,uint32_t generator)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  
  __s = spvGeneratorStr(generator >> 0x10);
  poVar3 = this->stream_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"; Generator: ",0xd);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
  }
  iVar1 = strcmp("Unknown",__s);
  if (iVar1 == 0) {
    poVar3 = this->stream_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  }
  poVar3 = this->stream_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"; ",2);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  return;
}

Assistant:

void InstructionDisassembler::EmitHeaderGenerator(uint32_t generator) {
  const char* generator_tool =
      spvGeneratorStr(SPV_GENERATOR_TOOL_PART(generator));
  stream_ << "; Generator: " << generator_tool;
  // For unknown tools, print the numeric tool value.
  if (0 == strcmp("Unknown", generator_tool)) {
    stream_ << "(" << SPV_GENERATOR_TOOL_PART(generator) << ")";
  }
  // Print the miscellaneous part of the generator word on the same
  // line as the tool name.
  stream_ << "; " << SPV_GENERATOR_MISC_PART(generator) << "\n";
}